

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void store_rect_16bit_to_32bit_avx2(__m256i a,int32_t *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i a_00;
  __m256i a_01;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 uVar7;
  undefined8 in_XMM0_Qb;
  undefined8 uVar8;
  undefined8 in_YMM0_H;
  longlong lVar9;
  undefined8 uVar10;
  undefined8 in_register_00001218;
  undefined8 uVar11;
  __m256i b_hi;
  __m256i b_lo;
  __m256i a_hi;
  __m256i a_lo;
  __m256i a_reoder;
  __m256i one;
  undefined8 local_240;
  undefined8 uStackY_238;
  undefined4 uStackY_230;
  int scale;
  undefined8 uVar12;
  undefined8 uVar13;
  longlong lVar14;
  undefined8 uStack_208;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  auVar2 = vpinsrw_avx(auVar2,1,7);
  uStack_d0 = auVar2._0_8_;
  uStack_c8 = auVar2._8_8_;
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar4 = vpermq_avx2(auVar3,0xd8);
  auVar5._16_8_ = uStack_d0;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_c8;
  auVar3 = vpunpcklwd_avx2(auVar4,auVar5);
  uVar7 = auVar3._0_8_;
  uVar8 = auVar3._8_8_;
  lVar9 = auVar3._16_8_;
  uStack_208 = auVar3._24_8_;
  auVar6._16_8_ = uStack_d0;
  auVar6._0_16_ = auVar1;
  auVar6._24_8_ = uStack_c8;
  auVar3 = vpunpckhwd_avx2(auVar4,auVar6);
  local_240 = auVar3._0_8_;
  uStackY_238 = auVar3._8_8_;
  uStackY_230 = auVar3._16_4_;
  scale = auVar3._20_4_;
  uVar11 = auVar3._24_8_;
  a_00[1] = uVar7;
  a_00[0] = uVar11;
  a_00[2] = uVar8;
  a_00[3] = lVar9;
  uVar12 = uVar7;
  uVar13 = uVar8;
  lVar14 = lVar9;
  scale_round_avx2(a_00,scale);
  uVar10 = CONCAT44(scale,uStackY_230);
  a_01[1] = uVar12;
  a_01[0] = uVar11;
  a_01[2] = uVar13;
  a_01[3] = lVar14;
  scale_round_avx2(a_01,scale);
  *in_RDI = uVar7;
  in_RDI[1] = uVar8;
  in_RDI[2] = lVar9;
  in_RDI[3] = uStack_208;
  in_RDI[4] = local_240;
  in_RDI[5] = uStackY_238;
  in_RDI[6] = uVar10;
  in_RDI[7] = uVar11;
  return;
}

Assistant:

static inline void store_rect_16bit_to_32bit_avx2(const __m256i a,
                                                  int32_t *const b) {
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i a_reoder = _mm256_permute4x64_epi64(a, 0xd8);
  const __m256i a_lo = _mm256_unpacklo_epi16(a_reoder, one);
  const __m256i a_hi = _mm256_unpackhi_epi16(a_reoder, one);
  const __m256i b_lo = scale_round_avx2(a_lo, NewSqrt2);
  const __m256i b_hi = scale_round_avx2(a_hi, NewSqrt2);
  _mm256_store_si256((__m256i *)b, b_lo);
  _mm256_store_si256((__m256i *)(b + 8), b_hi);
}